

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECatAccess.cpp
# Opt level: O3

long __thiscall bhf::ads::ECatAccess::ListECatMasters(ECatAccess *this,ostream *os)

{
  undefined1 *puVar1;
  string *psVar2;
  AdsDevice *this_00;
  long lVar3;
  ostream *poVar4;
  size_t sVar5;
  uint uVar6;
  uint32_t bytesRead;
  uint32_t numberOfDevices;
  uint16_t devType;
  vector<unsigned_short,_std::allocator<unsigned_short>_> deviceIds;
  AmsNetId netId;
  stringstream stream;
  char deviceName [255];
  uint32_t local_314;
  uint local_310;
  undefined1 local_30a [2];
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_308;
  AdsDevice *local_2f0;
  string local_2e8;
  AmsNetId local_2c6;
  stringstream local_2c0 [16];
  long local_2b0 [3];
  uint auStack_298 [22];
  ios_base local_240 [264];
  string local_138 [8];
  
  lVar3 = AdsDevice::ReadReqEx2(&this->device,0x5000,2,4,&local_310,&local_314);
  if (lVar3 == 0) {
    if (local_310 == 0) {
      lVar3 = 0;
    }
    else {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&local_308,(ulong)(local_310 + 1),(allocator_type *)local_2c0);
      lVar3 = AdsDevice::ReadReqEx2
                        (&this->device,0x5000,1,
                         (long)local_308.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage -
                         (long)local_308.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                         local_308.
                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                         .super__Vector_impl_data._M_start,&local_314);
      if (lVar3 == 0) {
        if (local_310 != 0) {
          uVar6 = 1;
          local_2f0 = &this->device;
          do {
            this_00 = local_2f0;
            lVar3 = AdsDevice::ReadReqEx2
                              (local_2f0,
                               local_308.
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_start[uVar6] + 0x5000,7,2,
                               local_30a,&local_314);
            if (lVar3 != 0) {
              std::__cxx11::stringstream::stringstream(local_2c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,"Reading type for device[",0x18);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] failed with 0x",0x10);
              *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                   *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
              std::ostream::_M_insert<long>((long)poVar4);
              std::__cxx11::stringbuf::str();
              Logger::Log(3,local_138);
              goto LAB_0011a515;
            }
            memset(local_138,0,0xff);
            lVar3 = AdsDevice::ReadReqEx2
                              (this_00,local_308.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar6] + 0x5000,1,
                               0xfe,local_138,&local_314);
            if (lVar3 != 0) {
              std::__cxx11::stringstream::stringstream(local_2c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,"Reading name for device[",0x18);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] failed with 0x",0x10);
              *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                   *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
              std::ostream::_M_insert<long>((long)poVar4);
              std::__cxx11::stringbuf::str();
              Logger::Log(3,&local_2e8);
LAB_0011a8f4:
              psVar2 = &local_2e8;
              goto LAB_0011a51d;
            }
            AmsNetId::AmsNetId(&local_2c6,0);
            lVar3 = AdsDevice::ReadReqEx2
                              (this_00,local_308.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar6] + 0x5000,5,6
                               ,&local_2c6,&local_314);
            if (lVar3 != 0) {
              std::__cxx11::stringstream::stringstream(local_2c0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_2b0,"Reading AmsNetId for device[",0x1c);
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] failed with 0x",0x10);
              *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
                   *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
              std::ostream::_M_insert<long>((long)poVar4);
              std::__cxx11::stringbuf::str();
              Logger::Log(3,&local_2e8);
              goto LAB_0011a8f4;
            }
            CountECatSlaves((ECatAccess *)this_00,&local_2c6);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," | ",3);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," | ",3);
            sVar5 = strlen((char *)local_138);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_138,sVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," | ",3);
            poVar4 = ::operator<<(poVar4,&local_2c6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," | ",3);
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            local_2c0[0] = (stringstream)0xa;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_2c0,1);
            uVar6 = uVar6 + 1;
          } while (uVar6 <= local_310);
        }
        lVar3 = 0;
      }
      else {
        std::__cxx11::stringstream::stringstream(local_2c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_2b0,"Reading device ids failed with 0x",0x21);
        *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) =
             *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) & 0xffffffb5 | 8;
        std::ostream::_M_insert<long>((long)local_2b0);
        std::__cxx11::stringbuf::str();
        Logger::Log(3,local_138);
LAB_0011a515:
        psVar2 = local_138;
LAB_0011a51d:
        puVar1 = *(undefined1 **)((psVar2->field_2)._M_local_buf + -0x10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar1 != &psVar2->field_2) {
          operator_delete(puVar1);
        }
        std::__cxx11::stringstream::~stringstream(local_2c0);
        std::ios_base::~ios_base(local_240);
      }
      if (local_308.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_308.
                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
  }
  else {
    std::__cxx11::stringstream::stringstream(local_2c0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2b0,"Reading device count failed with 0x",0x23);
    *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) =
         *(uint *)((long)auStack_298 + *(long *)(local_2b0[0] + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<long>((long)local_2b0);
    std::__cxx11::stringbuf::str();
    Logger::Log(3,local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
      operator_delete(local_138[0]._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::~stringstream(local_2c0);
    std::ios_base::~ios_base(local_240);
  }
  return lVar3;
}

Assistant:

long ECatAccess::ListECatMasters(std::ostream& os) const
{
    uint32_t numberOfDevices;
    uint32_t bytesRead;

    auto status = device.ReadReqEx2(
        IOADS_IGR_IODEVICESTATE_BASE,
        IOADS_IOF_READDEVCOUNT,
        sizeof(numberOfDevices), &numberOfDevices,
        &bytesRead);

    if (status != ADSERR_NOERR) {
        LOG_ERROR("Reading device count failed with 0x" << std::hex << status);
        return status;
    }

    if (numberOfDevices == 0) {
        return status;
    }

    // the first element of the vector is set to devCount,
    // so the actual device Ids start at index 1
    std::vector<uint16_t> deviceIds(numberOfDevices + 1);

    status = device.ReadReqEx2(
        IOADS_IGR_IODEVICESTATE_BASE,
        IOADS_IOF_READDEVIDS,
        deviceIds.capacity() * sizeof(uint16_t),
        deviceIds.data(), &bytesRead);

    if (status != ADSERR_NOERR) {
        LOG_ERROR("Reading device ids failed with 0x" << std::hex << status);
        return status;
    }

    // Skip the device count, which is at the first index
    for (uint32_t i = 1; i <= numberOfDevices; i++) {
        uint16_t devType;
        status = device.ReadReqEx2(
            IOADS_IGR_IODEVICESTATE_BASE + deviceIds[i],
            IOADS_IOF_READDEVTYPE,
            sizeof(devType),
            &devType,
            &bytesRead);

        if (status != ADSERR_NOERR) {
            LOG_ERROR("Reading type for device[" << deviceIds[i] << "] failed with 0x" << std::hex << status);
            return status;
        }

        char deviceName[0xff] = {0};
        status = device.ReadReqEx2(
            IOADS_IGR_IODEVICESTATE_BASE + deviceIds[i],
            IOADS_IOF_READDEVNAME,
            sizeof(deviceName) - 1,
            deviceName,
            &bytesRead);

        if (status != ADSERR_NOERR) {
            LOG_ERROR("Reading name for device[" << deviceIds[i] << "] failed with 0x" << std::hex << status);
            return status;
        }

        AmsNetId netId = {0};
        status = device.ReadReqEx2(
            IOADS_IGR_IODEVICESTATE_BASE + deviceIds[i],
            IOADS_IOF_READDEVNETID,
            sizeof(netId),
            &netId,
            &bytesRead);

        if (status != ADSERR_NOERR) {
            LOG_ERROR("Reading AmsNetId for device[" << deviceIds[i] << "] failed with 0x" << std::hex << status);
            return status;
        }

        const auto slaveCount = CountECatSlaves(netId);
        os << deviceIds[i] << " | " << devType << " | " << deviceName << " | " << netId << " | " << slaveCount << '\n';
    }
    return status;
}